

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruleset.cpp
# Opt level: O0

void __thiscall Ruleset::Ruleset(Ruleset *this)

{
  WithDiamondsAsTrump *this_00;
  WithoutTrump *this_01;
  WithSpadesAsTrump *this_02;
  WithCloverAsTrump *this_03;
  WithHeartAsTrump *this_04;
  WithJacksAsTrump *this_05;
  WithQueensAsTrump *this_06;
  Rule *pRVar1;
  Rule *local_260;
  pair<const_char_*,_TwoDiamondAAreHigh_*> local_258;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rule_*>
  local_248;
  Rule *local_220;
  pair<const_char_*,_SecondH10BeatsFirst_*> local_218;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rule_*>
  local_208;
  WithQueensAsTrump *local_1e0;
  pair<const_char_*,_WithQueensAsTrump_*> local_1d8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rule_*>
  local_1c8;
  WithJacksAsTrump *local_1a0;
  pair<const_char_*,_WithJacksAsTrump_*> local_198;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rule_*>
  local_188;
  WithHeartAsTrump *local_160;
  pair<const_char_*,_WithHeartAsTrump_*> local_158;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rule_*>
  local_148;
  WithCloverAsTrump *local_120;
  pair<const_char_*,_WithCloverAsTrump_*> local_118;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rule_*>
  local_108;
  WithSpadesAsTrump *local_e0;
  pair<const_char_*,_WithSpadesAsTrump_*> local_d8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rule_*>
  local_c8;
  WithoutTrump *local_a0;
  pair<const_char_*,_WithoutTrump_*> local_98;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rule_*>
  local_88;
  WithDiamondsAsTrump *local_50;
  pair<const_char_*,_WithDiamondsAsTrump_*> local_48;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rule_*>
  local_38;
  Ruleset *local_10;
  Ruleset *this_local;
  
  local_10 = this;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rule_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rule_*>_>_>
  ::vector(&this->m_nameToRule);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->m_enabledRules);
  std::vector<Rule_*,_std::allocator<Rule_*>_>::vector(&this->m_ruleInstances);
  this_00 = (WithDiamondsAsTrump *)operator_new(0x20);
  WithDiamondsAsTrump::WithDiamondsAsTrump(this_00);
  local_50 = this_00;
  local_48 = std::make_pair<char_const(&)[20],WithDiamondsAsTrump*>
                       ((char (*) [20])"WithDiamondsAsTrump",&local_50);
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rule_*>
  ::pair<const_char_*,_WithDiamondsAsTrump_*,_true>(&local_38,&local_48);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rule_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rule_*>_>_>
  ::push_back(&this->m_nameToRule,&local_38);
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rule_*>
  ::~pair(&local_38);
  this_01 = (WithoutTrump *)operator_new(0x20);
  (this_01->super_WithDiamondsAsTrump).super_DifferentTrumpRule.m_trumpCards.
  super__Vector_base<Card,_std::allocator<Card>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (this_01->super_WithDiamondsAsTrump).super_DifferentTrumpRule.m_trumpCards.
  super__Vector_base<Card,_std::allocator<Card>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)0x0;
  (this_01->super_WithDiamondsAsTrump).super_DifferentTrumpRule.super_Rule._vptr_Rule =
       (_func_int **)0x0;
  (this_01->super_WithDiamondsAsTrump).super_DifferentTrumpRule.m_trumpCards.
  super__Vector_base<Card,_std::allocator<Card>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  WithoutTrump::WithoutTrump(this_01);
  local_a0 = this_01;
  local_98 = std::make_pair<char_const(&)[13],WithoutTrump*>
                       ((char (*) [13])"WithoutTrump",&local_a0);
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rule_*>
  ::pair<const_char_*,_WithoutTrump_*,_true>(&local_88,&local_98);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rule_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rule_*>_>_>
  ::push_back(&this->m_nameToRule,&local_88);
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rule_*>
  ::~pair(&local_88);
  this_02 = (WithSpadesAsTrump *)operator_new(0x20);
  WithSpadesAsTrump::WithSpadesAsTrump(this_02);
  local_e0 = this_02;
  local_d8 = std::make_pair<char_const(&)[18],WithSpadesAsTrump*>
                       ((char (*) [18])"WithSpadesAsTrump",&local_e0);
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rule_*>
  ::pair<const_char_*,_WithSpadesAsTrump_*,_true>(&local_c8,&local_d8);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rule_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rule_*>_>_>
  ::push_back(&this->m_nameToRule,&local_c8);
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rule_*>
  ::~pair(&local_c8);
  this_03 = (WithCloverAsTrump *)operator_new(0x20);
  WithCloverAsTrump::WithCloverAsTrump(this_03);
  local_120 = this_03;
  local_118 = std::make_pair<char_const(&)[18],WithCloverAsTrump*>
                        ((char (*) [18])"WithCloverAsTrump",&local_120);
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rule_*>
  ::pair<const_char_*,_WithCloverAsTrump_*,_true>(&local_108,&local_118);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rule_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rule_*>_>_>
  ::push_back(&this->m_nameToRule,&local_108);
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rule_*>
  ::~pair(&local_108);
  this_04 = (WithHeartAsTrump *)operator_new(0x20);
  WithHeartAsTrump::WithHeartAsTrump(this_04);
  local_160 = this_04;
  local_158 = std::make_pair<char_const(&)[17],WithHeartAsTrump*>
                        ((char (*) [17])"WithHeartAsTrump",&local_160);
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rule_*>
  ::pair<const_char_*,_WithHeartAsTrump_*,_true>(&local_148,&local_158);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rule_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rule_*>_>_>
  ::push_back(&this->m_nameToRule,&local_148);
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rule_*>
  ::~pair(&local_148);
  this_05 = (WithJacksAsTrump *)operator_new(0x20);
  WithJacksAsTrump::WithJacksAsTrump(this_05);
  local_1a0 = this_05;
  local_198 = std::make_pair<char_const(&)[17],WithJacksAsTrump*>
                        ((char (*) [17])"WithJacksAsTrump",&local_1a0);
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rule_*>
  ::pair<const_char_*,_WithJacksAsTrump_*,_true>(&local_188,&local_198);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rule_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rule_*>_>_>
  ::push_back(&this->m_nameToRule,&local_188);
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rule_*>
  ::~pair(&local_188);
  this_06 = (WithQueensAsTrump *)operator_new(0x20);
  WithQueensAsTrump::WithQueensAsTrump(this_06);
  local_1e0 = this_06;
  local_1d8 = std::make_pair<char_const(&)[18],WithQueensAsTrump*>
                        ((char (*) [18])"WithQueensAsTrump",&local_1e0);
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rule_*>
  ::pair<const_char_*,_WithQueensAsTrump_*,_true>(&local_1c8,&local_1d8);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rule_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rule_*>_>_>
  ::push_back(&this->m_nameToRule,&local_1c8);
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rule_*>
  ::~pair(&local_1c8);
  pRVar1 = (Rule *)operator_new(8);
  ((Rule *)&pRVar1->_vptr_Rule)->_vptr_Rule = (_func_int **)0x0;
  SecondH10BeatsFirst::SecondH10BeatsFirst((SecondH10BeatsFirst *)pRVar1);
  local_220 = pRVar1;
  local_218 = std::make_pair<char_const(&)[23],SecondH10BeatsFirst*>
                        ((char (*) [23])"SecondH10BeatsFirstH10",(SecondH10BeatsFirst **)&local_220)
  ;
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rule_*>
  ::pair<const_char_*,_SecondH10BeatsFirst_*,_true>(&local_208,&local_218);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rule_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rule_*>_>_>
  ::push_back(&this->m_nameToRule,&local_208);
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rule_*>
  ::~pair(&local_208);
  pRVar1 = (Rule *)operator_new(8);
  ((Rule *)&pRVar1->_vptr_Rule)->_vptr_Rule = (_func_int **)0x0;
  TwoDiamondAAreHigh::TwoDiamondAAreHigh((TwoDiamondAAreHigh *)pRVar1);
  local_260 = pRVar1;
  local_258 = std::make_pair<char_const(&)[19],TwoDiamondAAreHigh*>
                        ((char (*) [19])"TwoDiamondAAreHigh",(TwoDiamondAAreHigh **)&local_260);
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rule_*>
  ::pair<const_char_*,_TwoDiamondAAreHigh_*,_true>(&local_248,&local_258);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rule_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rule_*>_>_>
  ::push_back(&this->m_nameToRule,&local_248);
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rule_*>
  ::~pair(&local_248);
  return;
}

Assistant:

Ruleset::Ruleset(){
    m_nameToRule.push_back(std::make_pair("WithDiamondsAsTrump", new WithDiamondsAsTrump()));
    m_nameToRule.push_back(std::make_pair("WithoutTrump" ,  new WithoutTrump()));
    m_nameToRule.push_back(std::make_pair("WithSpadesAsTrump",new  WithSpadesAsTrump()));
    m_nameToRule.push_back(std::make_pair("WithCloverAsTrump",new WithCloverAsTrump()));
    m_nameToRule.push_back(std::make_pair("WithHeartAsTrump",new WithHeartAsTrump()));
    m_nameToRule.push_back(std::make_pair("WithJacksAsTrump",new WithJacksAsTrump()));
    m_nameToRule.push_back(std::make_pair("WithQueensAsTrump",new WithQueensAsTrump()));
    m_nameToRule.push_back(std::make_pair("SecondH10BeatsFirstH10",new SecondH10BeatsFirst()));
    m_nameToRule.push_back(std::make_pair("TwoDiamondAAreHigh",new TwoDiamondAAreHigh()));
}